

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::ReleaseLast(ExtensionSet *this,int number)

{
  Extension *pEVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_> *pVVar2;
  string_view str;
  LogMessage LStack_18;
  
  pEVar1 = FindOrNull(this,number);
  if (pEVar1 == (Extension *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x38f,"extension != nullptr");
    str._M_str = "Index out-of-bounds (field is empty).";
    str._M_len = 0x25;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&LStack_18,str)
    ;
    goto LAB_0023c6a9;
  }
  if (pEVar1->is_repeated == false) {
    ReleaseLast((ExtensionSet *)&LStack_18);
LAB_0023c699:
    ReleaseLast((ExtensionSet *)&LStack_18);
  }
  else {
    if ((byte)(pEVar1->type - 0x13) < 0xee) goto LAB_0023c699;
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4) == 10) {
      pVVar2 = RepeatedPtrFieldBase::
               ReleaseLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                         ((RepeatedPtrFieldBase *)pEVar1->field_0);
      return pVVar2;
    }
  }
  ReleaseLast((ExtensionSet *)&LStack_18);
LAB_0023c6a9:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_18)
  ;
}

Assistant:

ExtensionSet::Extension* ExtensionSet::FindOrNull(int key) {
  const auto* const_this = this;
  return const_cast<ExtensionSet::Extension*>(const_this->FindOrNull(key));
}